

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::backtracer(backtracer *this,backtracer *other)

{
  undefined1 uVar1;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  std::mutex::mutex((mutex *)0x20eccd);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (bool)in_stack_ffffffffffffffbf);
  circular_q<spdlog::details::log_msg_buffer>::circular_q
            ((circular_q<spdlog::details::log_msg_buffer> *)0x20ecf0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
             ,(mutex_type *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  uVar1 = enabled((backtracer *)0x20ed0b);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
             (bool)in_stack_ffffffffffffffbf);
  circular_q<spdlog::details::log_msg_buffer>::operator=
            ((circular_q<spdlog::details::log_msg_buffer> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffc0),
             (circular_q<spdlog::details::log_msg_buffer> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20ed4c);
  return;
}

Assistant:

SPDLOG_INLINE backtracer::backtracer(const backtracer &other) {
    std::lock_guard<std::mutex> lock(other.mutex_);
    enabled_ = other.enabled();
    messages_ = other.messages_;
}